

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetsCommand.cxx
# Opt level: O2

bool __thiscall
cmInstallTargetsCommand::InitialPass
          (cmInstallTargetsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmMakefile *pcVar1;
  bool bVar2;
  cmGlobalGenerator *pcVar3;
  iterator iVar4;
  string *component;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  bool bVar6;
  string str;
  string runtime_dir;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"called with incorrect number of arguments",
               (allocator<char> *)&local_90);
    cmCommand::SetError(&this->super_cmCommand,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    bVar6 = false;
  }
  else {
    pcVar3 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    cmGlobalGenerator::EnableInstallTarget(pcVar3);
    pcVar1 = (this->super_cmCommand).Makefile;
    pbVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"/bin",(allocator<char> *)&local_90);
    while( true ) {
      __lhs = pbVar5 + 1;
      bVar6 = __lhs == (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
      if (bVar6) break;
      bVar2 = std::operator==(__lhs,"RUNTIME_DIRECTORY");
      if (bVar2) {
        if (pbVar5 + 2 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"called with RUNTIME_DIRECTORY but no actual directory",
                     (allocator<char> *)&local_50);
          cmCommand::SetError(&this->super_cmCommand,&local_90);
          goto LAB_001ee19a;
        }
        std::__cxx11::string::_M_assign((string *)&local_70);
        pbVar5 = pbVar5 + 2;
      }
      else {
        iVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pcVar1->Targets)._M_h,__lhs);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::operator+(&local_50,"Cannot find target: \"",__lhs);
          std::operator+(&local_90,&local_50,"\" to install.");
          std::__cxx11::string::~string((string *)&local_50);
          cmCommand::SetError(&this->super_cmCommand,&local_90);
          goto LAB_001ee19a;
        }
        std::__cxx11::string::assign
                  ((char *)((long)iVar4.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                  ._M_cur + 0x108));
        std::__cxx11::string::assign
                  ((char *)((long)iVar4.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                  ._M_cur + 0x128));
        *(undefined1 *)
         ((long)iVar4.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                ._M_cur + 0x1d4) = 1;
        pbVar5 = __lhs;
      }
    }
    pcVar3 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME",
               (allocator<char> *)&local_50);
    component = cmMakefile::GetSafeDefinition(pcVar1,&local_90);
    cmGlobalGenerator::AddInstallComponent(pcVar3,component);
LAB_001ee19a:
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return bVar6;
}

Assistant:

bool cmInstallTargetsCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // Enable the install target.
  this->Makefile->GetGlobalGenerator()->EnableInstallTarget();

  cmTargets& tgts = this->Makefile->GetTargets();
  std::vector<std::string>::const_iterator s = args.begin();
  ++s;
  std::string runtime_dir = "/bin";
  for (; s != args.end(); ++s) {
    if (*s == "RUNTIME_DIRECTORY") {
      ++s;
      if (s == args.end()) {
        this->SetError("called with RUNTIME_DIRECTORY but no actual "
                       "directory");
        return false;
      }

      runtime_dir = *s;
    } else {
      cmTargets::iterator ti = tgts.find(*s);
      if (ti != tgts.end()) {
        ti->second.SetInstallPath(args[0].c_str());
        ti->second.SetRuntimeInstallPath(runtime_dir.c_str());
        ti->second.SetHaveInstallRule(true);
      } else {
        std::string str = "Cannot find target: \"" + *s + "\" to install.";
        this->SetError(str);
        return false;
      }
    }
  }

  this->Makefile->GetGlobalGenerator()->AddInstallComponent(
    this->Makefile->GetSafeDefinition("CMAKE_INSTALL_DEFAULT_COMPONENT_NAME"));

  return true;
}